

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall helics::apps::App::App(App *this,string_view appName,FederateInfo *fedInfo)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__App_0094c820;
  std::
  make_shared<helics::CombinationFederate,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo_const&>
            (in_stack_ffffffffffffffc8,(FederateInfo *)&in_RDI->_M_string_length);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)((long)&in_RDI->field_2 + 8) = TVar1.internalTimeCode;
  __str = in_RDI + 1;
  std::__cxx11::string::string(in_RDI);
  this_00 = in_RDI + 2;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI);
  *(undefined1 *)&in_RDI[4]._M_dataplus._M_p = 0;
  *(undefined1 *)((long)&in_RDI[4]._M_dataplus._M_p + 1) = 0;
  *(undefined1 *)((long)&in_RDI[4]._M_dataplus._M_p + 2) = 0;
  *(undefined1 *)((long)&in_RDI[4]._M_dataplus._M_p + 3) = 0;
  *(undefined1 *)((long)&in_RDI[4]._M_dataplus._M_p + 4) = 0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x179682);
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17968c);
  Federate::getConfigFile_abi_cxx11_
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,__str);
  return;
}

Assistant:

App::App(std::string_view appName, const FederateInfo& fedInfo):
    fed(std::make_shared<CombinationFederate>(appName, fedInfo))
{
    configFileName = fed->getConfigFile();
}